

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo
          (cmComputeLinkInformation *this,string *fullPath,cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  string soName;
  string local_50;
  
  this_00 = this->Makefile;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar2 = cmMakefile::IsOn(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     (bVar2 = cmGeneratorTarget::HasMacOSXRpathInstallNameDir(target,&this->Config), !bVar2)) {
    return;
  }
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == UNKNOWN_LIBRARY) {
    AddLibraryRuntimeInfo(this,fullPath);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(target);
    if (TVar3 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetSOName(&local_50,target,&this->Config);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_50._M_string_length = (size_type)local_50._M_dataplus._M_p;
      }
      cmOrderDirectories::AddRuntimeLibrary
                ((this->OrderRuntimeSearchPath)._M_t.
                 super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                 .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,
                 (char *)local_50._M_string_length);
      if (this->LinkWithRuntimePath == true) {
        cmOrderDirectories::AddRuntimeLibrary
                  ((this->OrderLinkerSearchPath)._M_t.
                   super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                   .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,
                   (char *)local_50._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath, cmGeneratorTarget const* target)
{
  // Ignore targets on Apple where install_name is not @rpath.
  // The dependenty library can be found with other means such as
  // @loader_path or full paths.
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    if (!target->HasMacOSXRpathInstallNameDir(this->Config)) {
      return;
    }
  }

  // Libraries with unknown type must be handled using just the file
  // on disk.
  if (target->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
    this->AddLibraryRuntimeInfo(fullPath);
    return;
  }

  // Skip targets that are not shared libraries (modules cannot be linked).
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
    return;
  }

  // Try to get the soname of the library.  Only files with this name
  // could possibly conflict.
  std::string soName = target->GetSOName(this->Config);
  const char* soname = soName.empty() ? nullptr : soName.c_str();

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath, soname);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath, soname);
  }
}